

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

int __thiscall units::detail::unit_data::rootHertzModifier(unit_data *this,int power)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (int)SUB41(*this,0) >> 4;
  iVar1 = 0;
  if ((uVar2 * power != 0) && (iVar1 = 0, (~(uint)*this & 0x60000000) == 0 && (power & 1U) == 0)) {
    iVar1 = 9;
    if (-1 < (int)(uVar2 | power)) {
      iVar1 = -9;
    }
    iVar1 = iVar1 * (power >> 1);
  }
  return iVar1;
}

Assistant:

constexpr int rootHertzModifier(int power) const
        {
            return (second_ * power == 0 || ((e_flag_ & i_flag_) == 0U) ||
                    power % 2 != 0) ?
                0 :
                (power / 2) * ((second_ < 0) || (power < 0) ? 9 : -9);
        }